

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O1

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::render_hline
          (rasterizer_cells_aa<agg::cell_aa> *this,int ey,int x1,int y1,int x2,int y2)

{
  int *piVar1;
  cell_type *pcVar2;
  cell_type *pcVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  
  iVar10 = x2 >> 8;
  iVar5 = y2 - y1;
  if (iVar5 == 0) {
    if (((this->m_curr_cell).x == iVar10) && ((this->m_curr_cell).y == ey)) {
      return;
    }
    if ((this->m_curr_cell).cover != 0 || (this->m_curr_cell).area != 0) {
      if ((this->m_num_cells & 0xfff) == 0) {
        if (0x3ff < this->m_num_blocks) goto LAB_00110c16;
        allocate_block(this);
      }
      pcVar2 = this->m_curr_cell_ptr;
      this->m_curr_cell_ptr = pcVar2 + 1;
      iVar5 = (this->m_curr_cell).y;
      iVar9 = (this->m_curr_cell).cover;
      iVar20 = (this->m_curr_cell).area;
      pcVar2->x = (this->m_curr_cell).x;
      pcVar2->y = iVar5;
      pcVar2->cover = iVar9;
      pcVar2->area = iVar20;
      this->m_num_cells = this->m_num_cells + 1;
    }
LAB_00110c16:
    (this->m_curr_cell).x = iVar10;
    (this->m_curr_cell).y = ey;
    (this->m_curr_cell).cover = 0;
    (this->m_curr_cell).area = 0;
    return;
  }
  iVar9 = x1 >> 8;
  uVar12 = x1 & 0xff;
  if (iVar9 == iVar10) {
    piVar1 = &(this->m_curr_cell).cover;
    *piVar1 = *piVar1 + iVar5;
    iVar5 = ((x2 & 0xffU) + uVar12) * iVar5;
    goto LAB_00110ea7;
  }
  lVar19 = (long)x2 - (long)x1;
  if (lVar19 < 0) {
    lVar19 = -lVar19;
    iVar20 = -1;
    uVar11 = 0;
    uVar14 = uVar12;
  }
  else {
    uVar11 = 0x100;
    iVar20 = 1;
    uVar14 = 0x100 - uVar12;
  }
  lVar7 = (long)(int)(uVar14 * iVar5) % lVar19;
  iVar16 = (int)(lVar7 >> 0x3f) + (int)((long)(int)(uVar14 * iVar5) / lVar19);
  iVar5 = (this->m_curr_cell).cover + iVar16;
  (this->m_curr_cell).cover = iVar5;
  iVar13 = (uVar12 | uVar11) * iVar16 + (this->m_curr_cell).area;
  (this->m_curr_cell).area = iVar13;
  iVar15 = iVar20 + iVar9;
  pcVar2 = &this->m_curr_cell;
  if (((this->m_curr_cell).x != iVar15) || ((this->m_curr_cell).y != ey)) {
    if (iVar13 != 0 || iVar5 != 0) {
      if ((this->m_num_cells & 0xfff) == 0) {
        if (0x3ff < this->m_num_blocks) goto LAB_00110d49;
        allocate_block(this);
      }
      pcVar3 = this->m_curr_cell_ptr;
      this->m_curr_cell_ptr = pcVar3 + 1;
      iVar5 = pcVar2->y;
      iVar13 = (this->m_curr_cell).cover;
      iVar18 = (this->m_curr_cell).area;
      pcVar3->x = pcVar2->x;
      pcVar3->y = iVar5;
      pcVar3->cover = iVar13;
      pcVar3->area = iVar18;
      this->m_num_cells = this->m_num_cells + 1;
    }
LAB_00110d49:
    (this->m_curr_cell).x = iVar15;
    (this->m_curr_cell).y = ey;
    (this->m_curr_cell).cover = 0;
    (this->m_curr_cell).area = 0;
  }
  iVar5 = y1 + iVar16;
  if (iVar15 != iVar10) {
    lVar6 = (long)(((iVar16 + y2) - iVar5) * 0x100);
    lVar8 = lVar6 % lVar19;
    uVar17 = (uint)(lVar8 >> 0x3f);
    uVar14 = (uint)lVar19;
    uVar12 = uVar14;
    if (lVar7 < 0) {
      uVar12 = 0;
    }
    iVar13 = (int)lVar7 - uVar12;
    do {
      iVar13 = iVar13 + (int)lVar8 + (uVar17 & uVar14);
      uVar12 = uVar14;
      if (-1 >= iVar13) {
        uVar12 = 0;
      }
      iVar18 = (uint)(-1 < iVar13) + (int)(lVar6 / lVar19) + uVar17;
      iVar15 = (this->m_curr_cell).cover + iVar18;
      (this->m_curr_cell).cover = iVar15;
      iVar16 = iVar18 * 0x100 + (this->m_curr_cell).area;
      (this->m_curr_cell).area = iVar16;
      iVar21 = iVar20 * 2 + iVar9;
      if ((iVar21 != (this->m_curr_cell).x) || ((this->m_curr_cell).y != ey)) {
        if (iVar16 != 0 || iVar15 != 0) {
          if ((this->m_num_cells & 0xfff) == 0) {
            if (0x3ff < this->m_num_blocks) goto LAB_00110e6d;
            allocate_block(this);
          }
          pcVar3 = this->m_curr_cell_ptr;
          this->m_curr_cell_ptr = pcVar3 + 1;
          iVar15 = pcVar2->y;
          iVar16 = (this->m_curr_cell).cover;
          iVar4 = (this->m_curr_cell).area;
          pcVar3->x = pcVar2->x;
          pcVar3->y = iVar15;
          pcVar3->cover = iVar16;
          pcVar3->area = iVar4;
          this->m_num_cells = this->m_num_cells + 1;
        }
LAB_00110e6d:
        (this->m_curr_cell).x = iVar21;
        (this->m_curr_cell).y = ey;
        (this->m_curr_cell).cover = 0;
        (this->m_curr_cell).area = 0;
      }
      iVar13 = iVar13 - uVar12;
      iVar5 = iVar5 + iVar18;
      iVar9 = iVar9 + iVar20;
    } while (iVar10 - iVar20 != iVar9);
  }
  piVar1 = &(this->m_curr_cell).cover;
  *piVar1 = *piVar1 + (y2 - iVar5);
  iVar5 = ((x2 & 0xffU | 0x100) - uVar11) * (y2 - iVar5);
LAB_00110ea7:
  piVar1 = &(this->m_curr_cell).area;
  *piVar1 = *piVar1 + iVar5;
  return;
}

Assistant:

AGG_INLINE void rasterizer_cells_aa<Cell>::render_hline(int ey, 
                                                            int x1, int y1, 
                                                            int x2, int y2)
    {
        int ex1 = x1 >> poly_subpixel_shift;
        int ex2 = x2 >> poly_subpixel_shift;
        int fx1 = x1 & poly_subpixel_mask;
        int fx2 = x2 & poly_subpixel_mask;

        int delta, p, first;
        long long dx;
        int incr, lift, mod, rem;

        //trivial case. Happens often
        if(y1 == y2)
        {
            set_curr_cell(ex2, ey);
            return;
        }

        //everything is located in a single cell.  That is easy!
        if(ex1 == ex2)
        {
            delta = y2 - y1;
            m_curr_cell.cover += delta;
            m_curr_cell.area  += (fx1 + fx2) * delta;
            return;
        }

        //ok, we'll have to render a run of adjacent cells on the same
        //hline...
        p     = (poly_subpixel_scale - fx1) * (y2 - y1);
        first = poly_subpixel_scale;
        incr  = 1;

        dx = (long long)x2 - (long long)x1;

        if(dx < 0)
        {
            p     = fx1 * (y2 - y1);
            first = 0;
            incr  = -1;
            dx    = -dx;
        }

        delta = (int)(p / dx);
        mod   = (int)(p % dx);

        if(mod < 0)
        {
            delta--;
            mod += dx;
        }

        m_curr_cell.cover += delta;
        m_curr_cell.area  += (fx1 + first) * delta;

        ex1 += incr;
        set_curr_cell(ex1, ey);
        y1  += delta;

        if(ex1 != ex2)
        {
            p     = poly_subpixel_scale * (y2 - y1 + delta);
            lift  = (int)(p / dx);
            rem   = (int)(p % dx);

            if (rem < 0)
            {
                lift--;
                rem += dx;
            }

            mod -= dx;

            while (ex1 != ex2)
            {
                delta = lift;
                mod  += rem;
                if(mod >= 0)
                {
                    mod -= dx;
                    delta++;
                }

                m_curr_cell.cover += delta;
                m_curr_cell.area  += poly_subpixel_scale * delta;
                y1  += delta;
                ex1 += incr;
                set_curr_cell(ex1, ey);
            }
        }
        delta = y2 - y1;
        m_curr_cell.cover += delta;
        m_curr_cell.area  += (fx2 + poly_subpixel_scale - first) * delta;
    }